

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O0

void csp_id_prepend(csp_packet_t *packet)

{
  if (csp_conf.version == '\x02') {
    csp_id2_prepend(packet);
  }
  else {
    csp_id1_prepend(packet);
  }
  return;
}

Assistant:

void csp_id_prepend(csp_packet_t * packet) {
	if (csp_conf.version == 2) {
		csp_id2_prepend(packet);
	} else {
		csp_id1_prepend(packet);
	}
}